

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O0

void __thiscall Fl_Decl_Type::write_properties(Fl_Decl_Type *this)

{
  char cVar1;
  Fl_Decl_Type *this_local;
  
  Fl_Type::write_properties(&this->super_Fl_Type);
  cVar1 = this->public_;
  if (cVar1 == '\0') {
    write_string("private");
  }
  else if (cVar1 == '\x01') {
    write_string("public");
  }
  else if (cVar1 == '\x02') {
    write_string("protected");
  }
  if (this->static_ == '\0') {
    write_string("global");
  }
  else {
    write_string("local");
  }
  return;
}

Assistant:

void Fl_Decl_Type::write_properties() {
  Fl_Type::write_properties();
  switch (public_) {
    case 0: write_string("private"); break;
    case 1: write_string("public"); break;
    case 2: write_string("protected"); break;
  }
  if (static_) 
    write_string("local");
  else
    write_string("global");
}